

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.cpp
# Opt level: O2

void Imath_3_2::jacobiSVD<float>
               (Matrix33<float> *A,Matrix33<float> *U,Vec3<float> *S,Matrix33<float> *V,float tol,
               bool forcePositiveDeterminant)

{
  undefined1 auVar1 [12];
  int j;
  undefined1 auVar2 [16];
  bool bVar3;
  int i;
  long lVar4;
  float *pfVar5;
  long lVar6;
  int i_1;
  int iVar7;
  undefined3 in_register_00000081;
  uint uVar8;
  bool bVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined8 uVar20;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  float fVar21;
  float fVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  uint uVar33;
  uint uVar34;
  float fVar35;
  float p;
  float fVar36;
  float r;
  float fVar37;
  float r_1;
  undefined1 local_e8 [8];
  float fStack_e0;
  float fStack_dc;
  Matrix33<float> local_cc;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  undefined4 local_80;
  float local_7c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 local_68 [8];
  float fStack_60;
  float fStack_5c;
  undefined8 local_58;
  undefined8 uStack_50;
  float local_48;
  float fStack_44;
  uint uStack_40;
  uint uStack_3c;
  
  local_80 = CONCAT31(in_register_00000081,forcePositiveDeterminant);
  Matrix33<float>::Matrix33(&local_cc,A);
  Matrix33<float>::makeIdentity(U);
  Matrix33<float>::makeIdentity(V);
  local_7c = anon_unknown_20::maxOffDiag<float>(&local_cc);
  local_7c = local_7c * tol;
  fVar22 = local_cc.x[0][0];
  fVar37 = local_cc.x[1][1];
  fVar21 = local_cc.x[2][2];
  if ((local_7c != 0.0) || (NAN(local_7c))) {
    auVar19 = ZEXT416((uint)local_cc.x[1][0]);
    local_e8._4_4_ = local_cc.x[0][2];
    local_e8._0_4_ = local_cc.x[2][0];
    register0x00001248 = 0;
    fVar14 = local_cc.x[2][1];
    fVar25 = local_cc.x[1][2];
    fVar30 = 0.0;
    fVar13 = 0.0;
    fVar23 = 0.0;
    uVar8 = 0;
    fVar35 = local_cc.x[0][1];
    fVar32 = 0.0;
    fVar36 = 0.0;
    fStack_90 = 0.0;
    fStack_8c = 0.0;
    do {
      fVar11 = auVar19._0_4_;
      fVar12 = ABS(fVar35 - fVar11);
      fVar26 = ABS(fVar22 + fVar37) * tol;
      if (fVar12 <= fVar26) {
        fVar27 = fVar37 - fVar22;
        fVar29 = fVar35 + fVar11;
        fVar15 = 0.0;
        fVar10 = 1.0;
        fVar24 = 0.0;
        fVar32 = fVar23;
        fVar28 = fVar30;
        fVar31 = fVar13;
      }
      else {
        fVar10 = (fVar22 + fVar37) / (fVar35 - fVar11);
        fVar24 = 1.0 / SQRT(fVar10 * fVar10 + 1.0);
        fVar15 = (float)((uint)-fVar24 & -(uint)(fVar10 < 0.0) |
                        ~-(uint)(fVar10 < 0.0) & (uint)fVar24);
        fVar10 = fVar10 * fVar15;
        fVar27 = (fVar35 + fVar11) * fVar15 + (fVar37 - fVar22) * fVar10;
        fVar29 = fVar10 * fVar35 - fVar15 * fVar37;
        fVar29 = fVar29 + fVar29;
        fVar24 = fVar36;
        fVar28 = fVar32;
        fVar31 = fVar32;
      }
      if (ABS(fVar29) <= ABS(fVar27) * tol) {
        fVar31 = 0.0;
        fVar32 = 0.0;
        uVar33 = 0;
        uVar34 = 0;
        fVar28 = 1.0;
        if (fVar26 < fVar12) goto LAB_00105629;
        local_cc.x[1][0] = 0.0;
        local_cc.x[0][1] = 0.0;
        bVar9 = false;
        fVar32 = 0.0;
        fVar35 = 0.0;
        fVar12 = fVar23;
        local_58._0_4_ = (float)local_e8._0_4_;
        local_58._4_4_ = (float)local_e8._4_4_;
        uStack_50._0_4_ = fStack_e0;
        uStack_50._4_4_ = fStack_dc;
      }
      else {
        fVar27 = fVar27 / fVar29;
        fVar30 = 1.0 / (SQRT(fVar27 * fVar27 + 1.0) + ABS(fVar27));
        fVar32 = (float)((uint)fVar32 & 0x80000000);
        uVar33 = (uint)fVar28 & 0x80000000;
        uVar34 = (uint)fVar31 & 0x80000000;
        fVar31 = (float)((uint)-fVar30 & -(uint)(fVar27 < 0.0) |
                        ~-(uint)(fVar27 < 0.0) & (uint)fVar30);
        fVar28 = 1.0 / SQRT(fVar31 * fVar31 + 1.0);
        fVar31 = fVar31 * fVar28;
LAB_00105629:
        fVar13 = fVar31 * fVar10 + fVar15 * fVar28;
        local_cc.x[1][0] = 0.0;
        local_cc.x[0][1] = 0.0;
        _local_68 = ZEXT416((uint)fVar28);
        fVar30 = fVar10 * fVar28 + fVar15 * -fVar31;
        local_cc.x[0][0] =
             (fVar22 * fVar28 - fVar31 * fVar35) * fVar30 +
             -fVar13 * (fVar11 * fVar28 - fVar31 * fVar37);
        local_cc.x[1][1] =
             (fVar22 * fVar31 + fVar35 * fVar28) * fVar13 +
             (fVar11 * fVar31 + fVar37 * fVar28) * fVar30;
        local_58._0_4_ = fVar28 * (float)local_e8._0_4_ - fVar14 * fVar31;
        local_58._4_4_ = fVar30 * (float)local_e8._4_4_ - fVar25 * fVar13;
        uStack_50._0_4_ = fStack_e0 * 0.0 - fVar32 * 0.0;
        uStack_50._4_4_ = fVar24 * fStack_dc - fVar32 * 0.0;
        local_78 = fVar31 * (float)local_e8._0_4_ + fVar28 * fVar14;
        fStack_74 = fVar13 * (float)local_e8._4_4_ + fVar30 * fVar25;
        fStack_70 = fVar32 * fStack_e0 + 0.0;
        fStack_6c = fVar32 * fStack_dc + fVar24 * 0.0;
        local_a8 = local_cc.x[0][0];
        local_98 = local_cc.x[1][1];
        fStack_94 = fVar36;
        local_48 = fVar31;
        fStack_44 = fVar32;
        uStack_40 = uVar33;
        uStack_3c = uVar34;
        (anonymous_namespace)::jacobiRotateRight<float,0,1>(U,fVar30,fVar13);
        (anonymous_namespace)::jacobiRotateRight<float,0,1>(V,(float)local_68._0_4_,local_48);
        bVar9 = true;
        fVar36 = 0.0;
        fVar14 = local_78;
        fVar25 = fStack_74;
        fVar32 = fStack_70;
        fVar35 = fStack_6c;
        fVar22 = local_a8;
        fVar37 = local_98;
        fVar12 = fStack_94;
        fVar30 = fStack_90;
        fVar13 = fStack_8c;
      }
      fStack_8c = fVar35;
      fStack_90 = fVar32;
      fStack_94 = fVar25;
      local_98 = fVar14;
      fVar14 = ABS(local_58._4_4_ - (float)local_58);
      fVar25 = ABS(fVar22 + fVar21) * tol;
      if (fVar14 <= fVar25) {
        fVar28 = fVar21 - fVar22;
        fVar31 = local_58._4_4_ + (float)local_58;
        fVar26 = 0.0;
        fVar24 = 0.0;
        fVar11 = 1.0;
        fVar32 = 0.0;
        fVar35 = fVar23;
      }
      else {
        fVar11 = (fVar22 + fVar21) / (local_58._4_4_ - (float)local_58);
        fVar32 = 1.0 / SQRT(fVar11 * fVar11 + 1.0);
        fVar24 = (float)((uint)fVar36 & 0x80000000);
        fVar26 = (float)((uint)-fVar32 & -(uint)(fVar11 < 0.0) |
                        ~-(uint)(fVar11 < 0.0) & (uint)fVar32);
        fVar11 = fVar11 * fVar26;
        fVar28 = (local_58._4_4_ + (float)local_58) * fVar26 + (fVar21 - fVar22) * fVar11;
        fVar31 = fVar11 * local_58._4_4_ - fVar26 * fVar21;
        fVar31 = fVar31 + fVar31;
        fVar32 = fVar36;
        fVar35 = local_58._4_4_;
      }
      if (ABS(fVar31) <= ABS(fVar28) * tol) {
        fVar31 = 0.0;
        fVar28 = 1.0;
        fVar35 = 0.0;
        if (fVar25 < fVar14) goto LAB_0010591b;
        local_cc.x[2][0] = 0.0;
        local_cc.x[0][2] = 0.0;
        local_58 = 0;
        uStack_50 = 0;
        bVar3 = false;
      }
      else {
        fVar28 = fVar28 / fVar31;
        fVar14 = 1.0 / (SQRT(fVar28 * fVar28 + 1.0) + ABS(fVar28));
        fVar35 = (float)((uint)fVar35 & 0x80000000);
        fVar31 = (float)((uint)-fVar14 & -(uint)(fVar28 < 0.0) |
                        ~-(uint)(fVar28 < 0.0) & (uint)fVar14);
        fVar28 = 1.0 / SQRT(fVar31 * fVar31 + 1.0);
        fVar31 = fVar31 * fVar28;
LAB_0010591b:
        fStack_6c = 0.0;
        local_cc.x[2][0] = 0.0;
        fVar27 = -fVar21;
        fVar29 = -fVar23;
        local_cc.x[0][2] = 0.0;
        fVar10 = fVar31 * fVar11 + fVar26 * fVar28;
        fVar15 = fVar28 * fVar22 + -local_58._4_4_ * fVar31;
        fVar14 = fVar11 * fVar28 + -fVar31 * fVar26;
        fVar25 = fVar32 * fVar35 + fVar35 * (float)uStack_50;
        fVar11 = fVar36 * 0.0 + uStack_50._4_4_ * 0.0;
        fVar21 = fVar10 * (fVar22 * fVar31 + fVar28 * local_58._4_4_) +
                 fVar14 * ((float)local_58 * fVar31 + fVar21 * fVar28);
        fVar22 = fVar15 * fVar14 + -fVar10 * ((float)local_58 * fVar28 + fVar27 * fVar31);
        fVar23 = (fVar35 * fVar32 + -local_58._4_4_ * fVar35) * fVar25 +
                 fVar25 * ((float)local_58 * fVar35 + fVar23 * fVar35);
        fVar36 = (fVar36 * 0.0 + fVar24 * 0.0) * fVar11 +
                 fVar11 * ((float)local_58 * 0.0 + fVar29 * 0.0);
        local_cc.x[0][1] = fVar14 * 0.0 - local_98 * fVar10;
        local_cc.x[1][0] = fVar28 * 0.0 - fStack_94 * fVar31;
        local_58 = CONCAT44(local_cc.x[1][0],local_cc.x[0][1]);
        uStack_50 = CONCAT44(fVar11 * 0.0 - fStack_8c * fVar28,fVar25 * 0.0 - fStack_90 * fVar15);
        local_68._4_4_ = fVar28;
        local_68._0_4_ = fVar28;
        fStack_60 = fVar28;
        fStack_5c = fVar28;
        local_98 = fVar10 * 0.0 + fVar14 * local_98;
        fStack_94 = fVar31 * 0.0 + fVar28 * fStack_94;
        fStack_90 = fVar15 * 0.0 + fVar25 * fStack_90;
        fStack_8c = fVar28 * 0.0 + fVar11 * fStack_8c;
        local_cc.x[0][0] = fVar22;
        local_cc.x[2][2] = fVar21;
        local_a8 = fVar37;
        fStack_a4 = fVar12;
        fStack_a0 = fVar30;
        fStack_9c = fVar13;
        local_78 = fVar31;
        fStack_74 = fVar28;
        fStack_70 = fVar35;
        (anonymous_namespace)::jacobiRotateRight<float,0,2>(U,fVar14,fVar10);
        (anonymous_namespace)::jacobiRotateRight<float,0,2>(V,(float)local_68._0_4_,local_78);
        bVar3 = true;
        fVar37 = local_a8;
        fVar12 = fStack_a4;
      }
      fVar14 = ABS(fStack_94 - local_98);
      fVar25 = ABS(fVar21 + fVar37) * tol;
      if (fVar14 <= fVar25) {
        fVar35 = fVar21 - fVar37;
        fVar23 = fStack_94 + local_98;
        auVar16 = ZEXT416(0);
        fVar13 = 1.0;
        fVar32 = 0.0;
        fVar30 = fVar22;
      }
      else {
        fVar13 = (fVar21 + fVar37) / (fStack_94 - local_98);
        fVar32 = 1.0 / SQRT(fVar13 * fVar13 + 1.0);
        auVar16._0_8_ = CONCAT44(fVar22,(uint)-fVar32 & -(uint)(fVar13 < 0.0)) & 0x80000000ffffffff;
        auVar16._8_4_ = (uint)fVar23 & 0x80000000;
        auVar16._12_4_ = (uint)fVar36 & 0x80000000;
        auVar16 = auVar16 | ZEXT416(~-(uint)(fVar13 < 0.0) & (uint)fVar32);
        fVar32 = auVar16._0_4_;
        fVar13 = fVar13 * fVar32;
        fVar35 = (local_98 + fStack_94) * fVar32 + (fVar21 - fVar37) * fVar13;
        fVar23 = fVar13 * fStack_94 - fVar32 * fVar21;
        fVar23 = fVar23 + fVar23;
        fVar32 = fVar22;
        fVar30 = fStack_94;
      }
      uVar20 = auVar16._8_8_;
      if (ABS(fVar23) <= ABS(fVar35) * tol) {
        fVar35 = 1.0;
        fVar23 = 0.0;
        fVar30 = 0.0;
        if (fVar25 < fVar14) goto LAB_00105c03;
        local_cc.x[2][1] = 0.0;
        local_cc.x[1][2] = 0.0;
        local_98 = fVar22;
        fStack_94 = fVar22;
        fStack_90 = fVar22;
        fStack_8c = fVar22;
        if (!bVar9 && !bVar3) break;
        auVar2._4_4_ = (float)local_58;
        auVar2._0_4_ = local_58._4_4_;
        auVar2._8_8_ = 0;
        _local_e8 = auVar2 << 0x40;
        local_a8 = fVar37;
        fStack_a4 = fVar21;
        fStack_a0 = fVar12;
        fStack_9c = fVar22;
      }
      else {
        fVar35 = fVar35 / fVar23;
        fVar14 = 1.0 / (SQRT(fVar35 * fVar35 + 1.0) + ABS(fVar35));
        fVar30 = (float)((uint)fVar30 & 0x80000000);
        fVar23 = (float)((uint)-fVar14 & -(uint)(fVar35 < 0.0) |
                        ~-(uint)(fVar35 < 0.0) & (uint)fVar14);
        fVar35 = 1.0 / SQRT(fVar23 * fVar23 + 1.0);
        fVar23 = fVar23 * fVar35;
LAB_00105c03:
        fVar14 = fVar23 * fVar13 + auVar16._0_4_ * fVar35;
        fVar25 = fVar13 * fVar35 + -fVar23 * auVar16._0_4_;
        local_cc.x[1][1] =
             (fVar35 * fVar37 + -fStack_94 * fVar23) * fVar25 +
             -fVar14 * (local_98 * fVar35 + -fVar21 * fVar23);
        local_cc.x[2][2] =
             fVar14 * (fVar37 * fVar23 + fVar35 * fStack_94) +
             fVar25 * (local_98 * fVar23 + fVar21 * fVar35);
        fStack_70 = (fVar12 * 0.0 + -fStack_90 * 0.0) * (fVar12 * 0.0 + fStack_90 * 0.0) +
                    fVar25 * (local_98 * 0.0 + -fVar22 * 0.0);
        fStack_6c = (fVar30 * fVar32 + -fStack_8c * fVar30) * (fVar32 * fVar30 + fVar30 * fStack_8c)
                    + fVar25 * (local_98 * fVar30 + fVar22 * fVar30);
        local_cc.x[2][1] = 0.0;
        local_cc.x[1][2] = 0.0;
        auVar17._4_4_ = (float)local_58;
        auVar17._0_4_ = local_58._4_4_;
        auVar17._8_4_ = local_58._4_4_;
        auVar17._12_4_ = (float)local_58;
        uVar20 = auVar17._8_8_;
        local_68._4_4_ = fVar23;
        local_68._0_4_ = fVar35;
        fStack_60 = 0.0;
        fStack_5c = fVar30;
        local_cc.x[2][0] = fVar14 * local_58._4_4_ + fVar25 * 0.0;
        local_cc.x[0][2] = fVar23 * (float)local_58 + fVar35 * 0.0;
        local_cc.x[1][0] = fVar25 * local_58._4_4_ + fVar14 * -0.0;
        local_cc.x[0][1] = fVar35 * (float)local_58 + fVar23 * -0.0;
        local_e8._4_4_ = local_cc.x[0][2];
        local_e8._0_4_ = local_cc.x[2][0];
        fStack_e0 = local_cc.x[1][0];
        fStack_dc = local_cc.x[0][1];
        local_a8 = fVar23;
        fStack_a4 = fVar23;
        fStack_a0 = fVar23;
        fStack_9c = fVar23;
        local_98 = fVar22;
        fStack_94 = fVar22;
        fStack_90 = fVar22;
        fStack_8c = fVar22;
        local_78 = local_cc.x[1][1];
        fStack_74 = local_cc.x[2][2];
        (anonymous_namespace)::jacobiRotateRight<float,1,2>(U,fVar25,fVar14);
        (anonymous_namespace)::jacobiRotateRight<float,1,2>(V,(float)local_68._0_4_,local_a8);
        local_a8 = local_78;
        fStack_a4 = fStack_74;
        fStack_a0 = fStack_70;
        fStack_9c = fStack_6c;
      }
      fVar14 = anon_unknown_20::maxOffDiag<float>(&local_cc);
      fVar37 = local_a8;
      fVar21 = fStack_a4;
      fVar22 = local_98;
      if (fVar14 <= local_7c) break;
      fVar35 = local_e8._12_4_;
      auVar1._4_8_ = uVar20;
      auVar1._0_4_ = local_e8._4_4_;
      auVar18._0_8_ = auVar1._0_8_ << 0x20;
      auVar18._8_4_ = local_e8._8_4_;
      auVar18._12_4_ = fVar35;
      auVar19._8_8_ = local_e8._8_8_;
      auVar19._0_8_ = auVar18._8_8_;
      fVar14 = 0.0;
      fVar25 = 0.0;
      bVar9 = uVar8 < 0x13;
      fVar30 = fStack_a0;
      fVar13 = fStack_9c;
      fVar23 = fStack_a4;
      uVar8 = uVar8 + 1;
      fVar32 = fVar35;
      fVar36 = fStack_94;
    } while (bVar9);
  }
  S->x = fVar22;
  S->y = fVar37;
  S->z = fVar21;
  pfVar5 = (float *)U;
  for (lVar4 = 0; lVar4 != 3; lVar4 = lVar4 + 1) {
    if ((&S->x)[lVar4] < 0.0) {
      (&S->x)[lVar4] = -(&S->x)[lVar4];
      for (lVar6 = 0; lVar6 != 0x24; lVar6 = lVar6 + 0xc) {
        *(uint *)((long)pfVar5 + lVar6) = *(uint *)((long)pfVar5 + lVar6) ^ 0x80000000;
      }
    }
    pfVar5 = pfVar5 + 1;
  }
  lVar4 = 2;
  for (iVar7 = 0; iVar7 != 2; iVar7 = iVar7 + 1) {
    for (lVar6 = 0; lVar4 != lVar6; lVar6 = lVar6 + 1) {
      fVar22 = (&S->x)[lVar6];
      if (fVar22 < (&S->y)[lVar6]) {
        j = (int)lVar6;
        (&S->x)[lVar6] = (&S->y)[lVar6];
        (&S->y)[lVar6] = fVar22;
        anon_unknown_20::swapColumns<float>(U,j,j + 1);
        anon_unknown_20::swapColumns<float>(V,j,j + 1);
      }
    }
    lVar4 = lVar4 + -1;
  }
  if ((char)local_80 != '\0') {
    fVar22 = Matrix33<float>::determinant(U);
    if (fVar22 < 0.0) {
      for (lVar4 = 8; lVar4 != 0x2c; lVar4 = lVar4 + 0xc) {
        *(uint *)((long)U->x[0] + lVar4) = *(uint *)((long)U->x[0] + lVar4) ^ 0x80000000;
      }
      S->z = -S->z;
    }
    fVar22 = Matrix33<float>::determinant(V);
    if (fVar22 < 0.0) {
      for (lVar4 = 8; lVar4 != 0x2c; lVar4 = lVar4 + 0xc) {
        *(uint *)((long)V->x[0] + lVar4) = *(uint *)((long)V->x[0] + lVar4) ^ 0x80000000;
      }
      S->z = -S->z;
    }
  }
  return;
}

Assistant:

void
jacobiSVD (
    const IMATH_INTERNAL_NAMESPACE::Matrix33<T>& A,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       U,
    IMATH_INTERNAL_NAMESPACE::Vec3<T>&           S,
    IMATH_INTERNAL_NAMESPACE::Matrix33<T>&       V,
    const T                                      tol,
    const bool                                   forcePositiveDeterminant)
{
    twoSidedJacobiSVD (A, U, S, V, tol, forcePositiveDeterminant);
}